

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void do_nonatomic_op_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i32 addr,TCGv_i64 val,
                        TCGArg idx,MemOp memop,_Bool new_val,
                        _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict9 *gen)

{
  MemOp memop_00;
  TCGv_i64 val_00;
  TCGv_i64 val_01;
  TCGv_i64 val_02;
  uintptr_t o_1;
  uintptr_t o;
  
  val_00 = tcg_temp_new_i64(tcg_ctx);
  val_01 = tcg_temp_new_i64(tcg_ctx);
  memop_00 = tcg_canonicalize_memop(memop,true,false);
  tcg_gen_qemu_ld_i64_tricore(tcg_ctx,val_00,addr,idx,memop_00 & ~MO_ASHIFT);
  (*gen)(tcg_ctx,val_01,val_00,val);
  tcg_gen_qemu_st_i64_tricore(tcg_ctx,val_01,addr,idx,memop_00);
  val_02 = val_00;
  if (new_val) {
    val_02 = val_01;
  }
  tcg_gen_ext_i64(tcg_ctx,ret,val_02,memop_00);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(val_00 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(val_01 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_nonatomic_op_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv addr, TCGv_i64 val,
                                TCGArg idx, MemOp memop, bool new_val,
                                void (*gen)(TCGContext *tcg_ctx, TCGv_i64, TCGv_i64, TCGv_i64))
{
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

    memop = tcg_canonicalize_memop(memop, 1, 0);

    tcg_gen_qemu_ld_i64(tcg_ctx, t1, addr, idx, memop & ~MO_SIGN);
    gen(tcg_ctx, t2, t1, val);
    tcg_gen_qemu_st_i64(tcg_ctx, t2, addr, idx, memop);

    tcg_gen_ext_i64(tcg_ctx, ret, (new_val ? t2 : t1), memop);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
}